

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void AssignmentExpression_oreq_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *v;
  JsValue *res_00;
  JsValue *res_01;
  uint uVar1;
  uint uVar2;
  undefined1 local_a8 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  JsValue r4;
  JsValue v0;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_a8);
  res_01 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_a8,res_01);
  v = (JsValue *)((long)&r2.u + 8);
  (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])((JsAstNode *)na[1].location,context,v)
  ;
  res_00 = (JsValue *)((long)&r3.u + 8);
  JsGetValue(v,res_00);
  uVar1 = JsToInt32(res_01);
  uVar2 = JsToInt32(res_00);
  res->type = JS_NUMBER;
  (res->u).number = (double)(int)(uVar2 | uVar1);
  JsPutValue((JsValue *)local_a8,res,(JsValue *)((long)&r4.u + 8));
  return;
}

Assistant:

static void
AssignmentExpression_oreq_eval(na, context, res)
	struct JsAstNode *na; /* (struct AssignmentExpression_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstAssignmentExpressionNode *n = 
		CAST_NODE(na, JsAstAssignmentExpressionNode);
	struct JsValue r1, r2, r3, r4,v0;

	EVAL(n->lhs, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->expr, context, &r3);
	JsGetValue( &r3, &r4);
	BitwiseORExpression_common(&r2, &r4, context, res);
	JsPutValue(&r1, res,&v0);
}